

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ram_list_entities_for_policy.cc
# Opt level: O0

void anon_unknown.dwarf_dc1b7::Json2Type(Value *value,RamListEntitiesForPolicyUserType *item)

{
  bool bVar1;
  Value *pVVar2;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  RamListEntitiesForPolicyUserType *local_18;
  RamListEntitiesForPolicyUserType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (RamListEntitiesForPolicyUserType *)value;
  bVar1 = Json::Value::isMember(value,"UserId");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"UserId");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar2);
    std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"UserName");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"UserName");
    Json::Value::asString_abi_cxx11_(&local_58,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->user_name,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"DisplayName");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"DisplayName");
    Json::Value::asString_abi_cxx11_(&local_78,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->display_name,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"AttachDate");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"AttachDate");
    Json::Value::asString_abi_cxx11_(&local_98,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->attach_date,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, RamListEntitiesForPolicyUserType* item) {
  if(value.isMember("UserId")) {
    item->user_id = value["UserId"].asString();
  }
  if(value.isMember("UserName")) {
    item->user_name = value["UserName"].asString();
  }
  if(value.isMember("DisplayName")) {
    item->display_name = value["DisplayName"].asString();
  }
  if(value.isMember("AttachDate")) {
    item->attach_date = value["AttachDate"].asString();
  }
}